

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

void crnlib::utils::copy_words(uint16 *pDst,uint16 *pSrc,uint num,bool endian_switch)

{
  uint16 *pDst_end;
  bool endian_switch_local;
  uint16 *puStack_20;
  uint num_local;
  uint16 *pSrc_local;
  uint16 *pDst_local;
  
  if (endian_switch) {
    puStack_20 = pSrc;
    pSrc_local = pDst;
    while (pSrc_local != pDst + num) {
      *pSrc_local = *puStack_20 << 8 | *puStack_20 >> 8;
      puStack_20 = puStack_20 + 1;
      pSrc_local = pSrc_local + 1;
    }
  }
  else {
    memcpy(pDst,pSrc,(ulong)(num << 1));
  }
  return;
}

Assistant:

void copy_words(uint16* pDst, const uint16* pSrc, uint num, bool endian_switch)
        {
            if (!endian_switch)
            {
                memcpy(pDst, pSrc, num << 1U);
            }
            else
            {
                uint16* pDst_end = pDst + num;
                while (pDst != pDst_end)
                {
                    *pDst++ = swap16(*pSrc++);
                }
            }
        }